

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::Concat,_std::default_delete<verilogAST::Concat>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Concat,_std::default_delete<verilogAST::Concat>_> *node)

{
  undefined8 *puVar1;
  _Head_base<0UL,_verilogAST::Concat_*,_false> _Var2;
  long *in_RDX;
  undefined8 *puVar3;
  pointer *__ptr;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  new_args;
  long *local_68;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_60;
  long *local_58;
  _Head_base<0UL,_verilogAST::Concat_*,_false> local_50;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)(*in_RDX + 0x10);
  local_58 = in_RDX;
  local_50._M_head_impl = (Concat *)this;
  for (puVar3 = *(undefined8 **)(*in_RDX + 8); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_68 = (long *)*puVar3;
    *puVar3 = 0;
    (*(code *)(((node->_M_t).
                super___uniq_ptr_impl<verilogAST::Concat,_std::default_delete<verilogAST::Concat>_>.
                _M_t.
                super__Tuple_impl<0UL,_verilogAST::Concat_*,_std::default_delete<verilogAST::Concat>_>
                .super__Head_base<0UL,_verilogAST::Concat_*,_false>._M_head_impl)->super_Expression)
              .super_Node)(&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::allocator<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
    ::
    emplace_back<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>
              ((vector<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::allocator<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
                *)&local_48,
               (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
               &local_60);
    if (local_60._M_head_impl != (Expression *)0x0) {
      (*((local_60._M_head_impl)->super_Node)._vptr_Node[2])();
    }
    local_60._M_head_impl = (Expression *)0x0;
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 0x10))();
    }
    local_68 = (long *)0x0;
  }
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::_M_move_assign((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
                    *)(*local_58 + 8),&local_48);
  _Var2._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_Expression).super_Node._vptr_Node = (_func_int **)*local_58;
  *local_58 = 0;
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<verilogAST::Concat,_std::default_delete<verilogAST::Concat>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Concat,_std::default_delete<verilogAST::Concat>,_true,_true>)
         _Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Concat> Transformer::visit(std::unique_ptr<Concat> node) {
  std::vector<std::unique_ptr<Expression>> new_args;
  for (auto&& expr : node->args) {
    new_args.push_back(this->visit(std::move(expr)));
  }
  node->args = std::move(new_args);
  return node;
}